

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O2

void tinyusdz::tydra::anon_unknown_0::detail::DumpSkelNode
               (stringstream *ss,SkelNode *node,uint32_t indent)

{
  pointer pSVar1;
  SkelNode *pSVar2;
  ulong uVar3;
  ostream *poVar4;
  ostream *poVar5;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t extraout_EDX;
  uint32_t n_04;
  undefined4 in_register_00000014;
  matrix4d *v;
  matrix4d *v_00;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  uint uVar7;
  SkelNode *child;
  pointer node_00;
  allocator local_cd;
  uint local_cc;
  ostream *local_c8;
  string local_c0;
  SkelNode *local_a0;
  ulong local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_98 = CONCAT44(in_register_00000014,indent);
  poVar5 = (ostream *)(ss + 0x10);
  pprint::Indent_abi_cxx11_(&local_c0,(pprint *)(ulong)indent,indent);
  local_c8 = poVar5;
  poVar4 = ::std::operator<<(poVar5,(string *)&local_c0);
  poVar4 = ::std::operator<<(poVar4,(string *)&node->joint_name);
  ::std::operator<<(poVar4," {\n");
  ::std::__cxx11::string::_M_dispose();
  uVar7 = indent + 1;
  pprint::Indent_abi_cxx11_(&local_c0,(pprint *)(ulong)uVar7,n);
  poVar5 = ::std::operator<<(poVar5,(string *)&local_c0);
  poVar5 = ::std::operator<<(poVar5,"joint_path ");
  ::std::__cxx11::string::string((string *)&local_90,"\"",(allocator *)&local_70);
  quote(&local_50,&node->joint_path,&local_90);
  poVar5 = ::std::operator<<(poVar5,(string *)&local_50);
  ::std::operator<<(poVar5,"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  pprint::Indent_abi_cxx11_(&local_c0,(pprint *)(ulong)uVar7,n_00);
  poVar5 = local_c8;
  poVar4 = ::std::operator<<(local_c8,(string *)&local_c0);
  poVar4 = ::std::operator<<(poVar4,"joint_id ");
  local_a0 = node;
  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,node->joint_id);
  ::std::operator<<(poVar4,"\n");
  ::std::__cxx11::string::_M_dispose();
  pprint::Indent_abi_cxx11_(&local_c0,(pprint *)(ulong)uVar7,n_01);
  poVar5 = ::std::operator<<(poVar5,(string *)&local_c0);
  poVar5 = ::std::operator<<(poVar5,"bind_transform ");
  tinyusdz::to_string_abi_cxx11_(&local_90,(tinyusdz *)&node->bind_transform,v);
  ::std::__cxx11::string::string((string *)&local_70,"\"",&local_cd);
  quote(&local_50,&local_90,&local_70);
  poVar5 = ::std::operator<<(poVar5,(string *)&local_50);
  ::std::operator<<(poVar5,"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  pSVar2 = local_a0;
  local_cc = uVar7;
  pprint::Indent_abi_cxx11_(&local_c0,(pprint *)(ulong)uVar7,n_02);
  poVar5 = ::std::operator<<(local_c8,(string *)&local_c0);
  poVar5 = ::std::operator<<(poVar5,"rest_transform ");
  tinyusdz::to_string_abi_cxx11_(&local_90,(tinyusdz *)&pSVar2->rest_transform,v_00);
  ::std::__cxx11::string::string((string *)&local_70,"\"",&local_cd);
  quote(&local_50,&local_90,&local_70);
  poVar5 = ::std::operator<<(poVar5,(string *)&local_50);
  ::std::operator<<(poVar5,"\n");
  ::std::__cxx11::string::_M_dispose();
  uVar3 = local_98;
  ::std::__cxx11::string::_M_dispose();
  poVar5 = local_c8;
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  n_04 = n_03;
  if ((pSVar2->children).
      super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pSVar2->children).
      super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_c0,(pprint *)(ulong)local_cc,n_03);
    poVar4 = ::std::operator<<(poVar5,(string *)&local_c0);
    ::std::operator<<(poVar4,"children {\n");
    ::std::__cxx11::string::_M_dispose();
    pSVar1 = (pSVar2->children).
             super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = extraout_RDX;
    for (node_00 = (pSVar2->children).
                   super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
                   ._M_impl.super__Vector_impl_data._M_start; node_00 != pSVar1;
        node_00 = node_00 + 1) {
      DumpSkelNode(ss,node_00,(int)uVar3 + 2);
      uVar6 = extraout_RDX_00;
    }
    pprint::Indent_abi_cxx11_(&local_c0,(pprint *)(ulong)local_cc,(uint32_t)uVar6);
    poVar4 = ::std::operator<<(poVar5,(string *)&local_c0);
    ::std::operator<<(poVar4,"}\n");
    ::std::__cxx11::string::_M_dispose();
    n_04 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_c0,(pprint *)(uVar3 & 0xffffffff),n_04);
  poVar5 = ::std::operator<<(poVar5,(string *)&local_c0);
  ::std::operator<<(poVar5,"}\n");
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void DumpSkelNode(std::stringstream &ss, const SkelNode &node, uint32_t indent) {

  ss << pprint::Indent(indent) << node.joint_name << " {\n";

  ss << pprint::Indent(indent + 1) << "joint_path " << quote(node.joint_path) << "\n";
  ss << pprint::Indent(indent + 1) << "joint_id " << node.joint_id << "\n";
  ss << pprint::Indent(indent + 1) << "bind_transform " << quote(tinyusdz::to_string(node.bind_transform)) << "\n";
  ss << pprint::Indent(indent + 1) << "rest_transform " << quote(tinyusdz::to_string(node.rest_transform)) << "\n";

  if (node.children.size()) {
    ss << pprint::Indent(indent + 1) << "children {\n";
    for (const auto &child : node.children) {
      DumpSkelNode(ss, child, indent + 2);
    }
    ss << pprint::Indent(indent + 1) << "}\n";
  }

  ss << pprint::Indent(indent) << "}\n";
}